

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::AddRibosome(Model *this,int footprint,double speed,int copy_number)

{
  SpeciesTracker *this_00;
  allocator local_109;
  string local_108;
  SpeciesTracker *local_e8;
  SpeciesTracker *tracker;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  Polymerase pol;
  int copy_number_local;
  double speed_local;
  int footprint_local;
  Model *this_local;
  
  pol.super_MobileElement._124_4_ = copy_number;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"__ribosome",&local_c9);
  Polymerase::Polymerase((Polymerase *)local_a8,&local_c8,footprint,speed);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::vector<Polymerase,_std::allocator<Polymerase>_>::push_back
            (&this->polymerases_,(value_type *)local_a8);
  this_00 = SpeciesTracker::Instance();
  local_e8 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"__ribosome",&local_109);
  SpeciesTracker::Increment(this_00,&local_108,pol.super_MobileElement._124_4_);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  Polymerase::~Polymerase((Polymerase *)local_a8);
  return;
}

Assistant:

void Model::AddRibosome(int footprint, double speed, int copy_number) {
  auto pol = Polymerase("__ribosome", footprint, speed);
  polymerases_.push_back(pol);
  auto &tracker = SpeciesTracker::Instance();
  tracker.Increment("__ribosome", copy_number);
}